

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_paramattr_group_block
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  int iVar1;
  value_type vVar2;
  undefined8 uVar3;
  size_t sVar4;
  bool bVar5;
  void *pvVar6;
  size_type sVar7;
  const_reference pvVar8;
  vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
  *this_00;
  undefined1 local_10b8 [3];
  bool has_type;
  String value;
  String kind;
  bool has_value;
  size_t count;
  size_t i;
  mapped_type *attr_group;
  uint64_t index;
  uint64_t group_id;
  BlockOrRecord *child;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<BlockOrRecord> *__range1;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  BlockOrRecord *entry_local;
  ModuleParseContext *this_local;
  
  bVar5 = std::
          unordered_map<unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>_>
          ::empty(&this->attribute_groups);
  if (bVar5) {
    __end1 = std::
             vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>::
             begin(&entry->children);
    child = (BlockOrRecord *)
            std::
            vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>::
            end(&entry->children);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
                                       *)&child), bVar5) {
      group_id = (uint64_t)
                 __gnu_cxx::
                 __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
                 ::operator*(&__end1);
      bVar5 = BlockOrRecord::IsRecord((BlockOrRecord *)group_id);
      if ((bVar5) && (*(int *)group_id == 3)) {
        sVar7 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_> *)
                           (group_id + 0x20));
        if (sVar7 < 3) {
          this_local._7_1_ = 0;
          goto LAB_002382f3;
        }
        pvVar8 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                 operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_> *
                            )(group_id + 0x20),0);
        index = *pvVar8;
        pvVar8 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                 operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_> *
                            )(group_id + 0x20),1);
        if (*pvVar8 == 0xffffffff) {
          this_00 = (vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
                     *)std::
                       unordered_map<unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>_>_>_>_>
                       ::operator[](&this->attribute_groups,&index);
          count = 2;
          sVar7 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                              *)(group_id + 0x20));
          sVar4 = count;
          while (count = sVar4, count < sVar7) {
            pvVar8 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                     operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                 *)(group_id + 0x20),count);
            if (*pvVar8 == 0) {
              sVar4 = count + 2;
            }
            else {
              pvVar8 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                       operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                   *)(group_id + 0x20),count);
              if (*pvVar8 == 1) {
                if (sVar7 <= count + 1) {
                  this_local._7_1_ = 0;
                  goto LAB_002382f3;
                }
                pvVar8 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                         ::operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       *)(group_id + 0x20),count + 1);
                iVar1 = (int)*pvVar8;
                if ((((iVar1 == 1) || (iVar1 == 0x19)) || (iVar1 - 0x29U < 2)) ||
                   (sVar4 = count + 2, iVar1 == 0x33)) {
                  sVar4 = count + 3;
                }
              }
              else {
                pvVar8 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                         ::operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       *)(group_id + 0x20),count);
                if ((*pvVar8 == 3) ||
                   (pvVar8 = std::
                             vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                             operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                         *)(group_id + 0x20),count), *pvVar8 == 4)) {
                  pvVar8 = std::
                           vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                           operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       *)(group_id + 0x20),count);
                  vVar2 = *pvVar8;
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  ::basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                  *)((long)&value.field_2 + 8));
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  ::basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                  *)local_10b8);
                  sVar4 = count;
                  while( true ) {
                    count = sVar4 + 1;
                    pvVar8 = std::
                             vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                             operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                         *)(group_id + 0x20),count);
                    if (*pvVar8 == 0 || sVar7 <= count) break;
                    pvVar8 = std::
                             vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                             operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                         *)(group_id + 0x20),count);
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                    ::push_back((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                 *)((long)&value.field_2 + 8),(char)*pvVar8);
                    sVar4 = count;
                  }
                  pvVar8 = std::
                           vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                           operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       *)(group_id + 0x20),count);
                  if (*pvVar8 == 0) {
                    count = sVar4 + 2;
                    if (vVar2 == 4) {
                      while (pvVar8 = std::
                                      vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                      ::operator[]((
                                                  vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                                  *)(group_id + 0x20),count),
                            *pvVar8 != 0 && count < sVar7) {
                        pvVar8 = std::
                                 vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                 ::operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                               *)(group_id + 0x20),count);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        ::push_back((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                     *)local_10b8,(char)*pvVar8);
                        count = count + 1;
                      }
                      pvVar8 = std::
                               vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                               ::operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                             *)(group_id + 0x20),count);
                      if (*pvVar8 != 0) {
                        this_local._7_1_ = 0;
                        bVar5 = true;
                        goto LAB_002381b2;
                      }
                      count = count + 1;
                    }
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>,dxil_spv::ThreadLocalAllocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>>>
                    ::
                    emplace_back<std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>>
                              (this_00,(basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                        *)((long)&value.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                *)local_10b8);
                    bVar5 = false;
                  }
                  else {
                    this_local._7_1_ = 0;
                    bVar5 = true;
                  }
LAB_002381b2:
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                   *)local_10b8);
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  ::~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                   *)((long)&value.field_2 + 8));
                  sVar4 = count;
                  if (bVar5) goto LAB_002382f3;
                }
                else {
                  pvVar8 = std::
                           vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                           operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       *)(group_id + 0x20),count);
                  if ((*pvVar8 != 5) &&
                     (pvVar8 = std::
                               vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                               ::operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                             *)(group_id + 0x20),count), *pvVar8 != 6)) {
                    this_local._7_1_ = 0;
                    goto LAB_002382f3;
                  }
                  pvVar8 = std::
                           vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                           operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       *)(group_id + 0x20),count);
                  vVar2 = *pvVar8;
                  if (sVar7 <= count + 1) {
                    this_local._7_1_ = 0;
                    goto LAB_002382f3;
                  }
                  pvVar8 = std::
                           vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                           operator[]((vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                       *)(group_id + 0x20),count + 1);
                  sVar4 = count + 2;
                  if (((int)*pvVar8 == 3) && (vVar2 == 6)) {
                    sVar4 = count + 3;
                  }
                }
              }
            }
          }
          if (sVar7 < count) {
            this_local._7_1_ = 0;
            goto LAB_002382f3;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_LLVMBC::BlockOrRecord_*,_std::vector<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 1;
  }
  else {
    buffer._4088_8_ = dxil_spv::get_thread_log_callback();
    if ((LoggingCallback)buffer._4088_8_ == (LoggingCallback)0x0) {
      fprintf(_stderr,"[ERROR]: Cannot use multiple group blocks.\n");
      fflush(_stderr);
    }
    else {
      snprintf((char *)&__range1,0x1000,"Cannot use multiple group blocks.\n");
      uVar3 = buffer._4088_8_;
      pvVar6 = dxil_spv::get_thread_log_callback_userdata();
      (*(code *)uVar3)(pvVar6,2,&__range1);
    }
    this_local._7_1_ = 0;
  }
LAB_002382f3:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ModuleParseContext::parse_paramattr_group_block(const BlockOrRecord &entry)
{
	if (!attribute_groups.empty())
	{
		LOGE("Cannot use multiple group blocks.\n");
		return false;
	}

	for (auto &child : entry.children)
	{
		if (!child.IsRecord())
			continue;
		if (AttributeCodes(child.id) != AttributeCodes::GroupCodeEntry)
			continue;

		if (child.ops.size() < 3)
			return false;

		uint64_t group_id = child.ops[0];
		uint64_t index = child.ops[1];

		if (index != ~0u) // Only care about attributes on function scope
			continue;

		auto &attr_group = attribute_groups[group_id];

		size_t i = 2;
		size_t count = child.ops.size();
		while (i < count)
		{
			if (child.ops[i] == 0) // Enum attribute, skip 2 values
			{
				i += 2;
			}
			else if (child.ops[i] == 1) // Integer attribute, skip 2 or 3 values
			{
				i++;
				if (i >= count)
					return false;

				switch (AttributeRecord(child.ops[i++]))
				{
				case AttributeRecord::ALIGNMENT:
				case AttributeRecord::STACK_ALIGNMENT:
				case AttributeRecord::ALLOC_SIZE:
				case AttributeRecord::DEREFERENCEABLE:
				case AttributeRecord::DEREFERENCEABLE_OR_NULL:
					i++;
					break;

				default:
					break;
				}
			}
			else if (child.ops[i] == 3 || child.ops[i] == 4) // String attribute
			{
				bool has_value = child.ops[i++] == 4;
				String kind, value;

				while (child.ops[i] != 0 && i < count)
					kind.push_back(char(child.ops[i++]));
				if (child.ops[i] != 0)
					return false;
				i++;

				if (has_value)
				{
					while (child.ops[i] != 0 && i < count)
						value.push_back(char(child.ops[i++]));
					if (child.ops[i] != 0)
						return false;
					i++;
				}
				attr_group.emplace_back(std::move(kind), std::move(value));
			}
			else if (child.ops[i] == 5 || child.ops[i] == 6) // Value attribute
			{
				bool has_type = child.ops[i++] == 6;
				if (i >= count)
					return false;
				if (AttributeRecord(child.ops[i++]) == AttributeRecord::BY_VAL && has_type)
					i++;
			}
			else
				return false;
		}

		if (i > count)
			return false;
	}

	return true;
}